

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

void __thiscall
irr::scene::CSceneManager::setActiveCamera(CSceneManager *this,ICameraSceneNode *camera)

{
  code *pcVar1;
  ICameraSceneNode *pIVar2;
  
  if (camera != (ICameraSceneNode *)0x0) {
    pcVar1 = (camera->super_ISceneNode)._vptr_ISceneNode[-3] + -0x20 +
             (long)(camera->super_ISceneNode).AbsoluteTransformation.M;
    *(int *)pcVar1 = *(int *)pcVar1 + 1;
  }
  pIVar2 = this->ActiveCamera;
  if (pIVar2 != (ICameraSceneNode *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_ISceneNode)._vptr_ISceneNode[-3] + -0x30 +
               (long)(pIVar2->super_ISceneNode).AbsoluteTransformation.M));
  }
  this->ActiveCamera = camera;
  return;
}

Assistant:

void CSceneManager::setActiveCamera(ICameraSceneNode *camera)
{
	if (camera)
		camera->grab();
	if (ActiveCamera)
		ActiveCamera->drop();

	ActiveCamera = camera;
}